

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_op.cc
# Opt level: O1

PcodeOp * Funcdata::findPrimaryBranch
                    (const_iterator iter,const_iterator enditer,bool findbranch,bool findcall,
                    bool findreturn)

{
  bool bVar1;
  PcodeOp *unaff_R12;
  PcodeOp *pPVar2;
  
  do {
    if (iter._M_node == enditer._M_node) {
      return (PcodeOp *)0x0;
    }
    pPVar2 = (PcodeOp *)iter._M_node[1]._M_right;
    switch(pPVar2->opcode->opcode) {
    case CPUI_BRANCH:
    case CPUI_CBRANCH:
      if ((!findbranch) ||
         (((*(pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start)->flags & 2) != 0)) break;
LAB_002a0634:
      bVar1 = false;
      goto LAB_002a0639;
    case CPUI_BRANCHIND:
      if (findbranch) goto LAB_002a0634;
      break;
    case CPUI_CALL:
    case CPUI_CALLIND:
      if (findcall) goto LAB_002a0634;
      break;
    case CPUI_RETURN:
      if (findreturn) goto LAB_002a0634;
    }
    iter._M_node = (_Base_ptr)std::_Rb_tree_increment(iter._M_node);
    bVar1 = true;
    pPVar2 = unaff_R12;
LAB_002a0639:
    unaff_R12 = pPVar2;
    if (!bVar1) {
      return pPVar2;
    }
  } while( true );
}

Assistant:

PcodeOp *Funcdata::findPrimaryBranch(PcodeOpTree::const_iterator iter,PcodeOpTree::const_iterator enditer,
				     bool findbranch,bool findcall,bool findreturn)
{
  while(iter != enditer) {
    PcodeOp *op = (*iter).second;
    switch(op->code()) {
    case CPUI_BRANCH:
    case CPUI_CBRANCH:
      if (findbranch) {
	if (!op->getIn(0)->isConstant()) // Make sure this is not an internal branch
	  return op;
      }
      break;
    case CPUI_BRANCHIND:
      if (findbranch)
	return op;
      break;
    case CPUI_CALL:
    case CPUI_CALLIND:
      if (findcall)
	return op;
      break;
    case CPUI_RETURN:
      if (findreturn)
	return op;
      break;
    default:
      break;
    }
    ++iter;
  }
  return (PcodeOp *)0;
}